

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_hash_keyless_list_dfs(lyd_node *child,uint32_t *hash)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t *hash_local;
  lyd_node *child_local;
  
  hash_local = (uint32_t *)child;
  do {
    if (hash_local == (uint32_t *)0x0) {
      return;
    }
    iVar1 = *(int *)(*(long *)hash_local + 0x38);
    if (iVar1 == 1) {
      lyd_hash_keyless_list_dfs(*(lyd_node **)(hash_local + 0x10),hash);
    }
    else {
      if ((iVar1 != 4) && (iVar1 != 8)) {
        if (iVar1 == 0x10) {
          iVar1 = lyd_list_has_keys((lyd_node *)hash_local);
          if (iVar1 != 0) {
            lyd_hash_keyless_list_dfs(*(lyd_node **)(hash_local + 0x10),hash);
          }
          goto LAB_00197fe2;
        }
        if ((iVar1 != 0x20) && (iVar1 != 0x8020)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0x156,"void lyd_hash_keyless_list_dfs(struct lyd_node *, uint32_t *)");
        }
      }
      uVar2 = dict_hash_multi(*hash,(char *)(hash_local + 0xc),4);
      *hash = uVar2;
    }
LAB_00197fe2:
    hash_local = *(uint32_t **)(hash_local + 6);
  } while( true );
}

Assistant:

static void
lyd_hash_keyless_list_dfs(struct lyd_node *child, uint32_t *hash)
{
    LY_TREE_FOR(child, child) {
        switch (child->schema->nodetype) {
        case LYS_CONTAINER:
            lyd_hash_keyless_list_dfs(child->child, hash);
            break;
        case LYS_LIST:
            /* ignore lists with missing keys */
            if (lyd_list_has_keys(child)) {
                lyd_hash_keyless_list_dfs(child->child, hash);
            }
            break;
        case LYS_LEAFLIST:
        case LYS_ANYXML:
        case LYS_ANYDATA:
        case LYS_LEAF:
            *hash = dict_hash_multi(*hash, (char *)&child->hash, sizeof child->hash);
            break;
        default:
            assert(0);
        }
    }
}